

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrimitiveRestartTests.cpp
# Opt level: O1

void * __thiscall
deqp::gles3::Functional::PrimitiveRestartCase::getIndexPtr(PrimitiveRestartCase *this,int indexNdx)

{
  IndexType IVar1;
  
  IVar1 = this->m_indexType;
  if (IVar1 == INDEX_UNSIGNED_INT) {
    return (this->m_indicesUI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + indexNdx;
  }
  if (IVar1 != INDEX_UNSIGNED_SHORT) {
    if (IVar1 == INDEX_UNSIGNED_BYTE) {
      return (this->m_indicesUB).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start + indexNdx;
    }
    return (void *)0x0;
  }
  return (this->m_indicesUS).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
         _M_impl.super__Vector_impl_data._M_start + indexNdx;
}

Assistant:

void* PrimitiveRestartCase::getIndexPtr (int indexNdx)
{
	switch (m_indexType)
	{
		case INDEX_UNSIGNED_BYTE:	return (void*)&m_indicesUB[indexNdx];
		case INDEX_UNSIGNED_SHORT:	return (void*)&m_indicesUS[indexNdx];
		case INDEX_UNSIGNED_INT:	return (void*)&m_indicesUI[indexNdx];
		default:
			DE_ASSERT(DE_FALSE);
			return DE_NULL;
	}
}